

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

ByteCodeUsesInstr * __thiscall
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns
          (Inline *this,Instr *callInstr,Instr *funcObjCheckInsertInstr,
          FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,bool isBuiltIn,bool isCtor,
          bool isInlined)

{
  Inline *funcOpnd;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  FixedFieldInfo *this_00;
  intptr_t iVar6;
  intptr_t iVar7;
  ByteCodeUsesInstr *this_01;
  BailOutInstrTemplate<IR::Instr> *bailOutInstr;
  char *this_02;
  byte bVar8;
  bool local_32;
  byte local_31;
  
  pSVar4 = IR::Opnd::GetStackSym(callInstr->m_src1);
  local_31 = callInstr->m_src1->field_0xb;
  bVar2 = TryOptimizeCallInstrWithFixedMethod
                    (this,callInstr,inlineeInfo,isPolymorphic,isBuiltIn,isCtor,isInlined,&local_32,
                     false,0);
  if (bVar2) {
    if (callInstr->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fc,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar2) goto LAB_0054e296;
      *puVar5 = 0;
    }
    this_00 = IR::Instr::GetFixedFunction(callInstr);
    iVar6 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    iVar7 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
    if (iVar6 != iVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fd,
                         "(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr())"
                         ,
                         "callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr()"
                        );
      if (!bVar2) {
LAB_0054e296:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar8 = local_31 & 8;
    this_01 = IR::ByteCodeUsesInstr::New(callInstr);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(this_01,(bool)(bVar8 >> 3),(pSVar4->super_Sym).m_id)
    ;
    IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
  }
  else {
    bailOutInstr = IR::BailOutInstrTemplate<IR::Instr>::New
                             (BailOnNotBuiltIn,BailOutOnInlineFunction,callInstr,callInstr->m_func);
    funcOpnd = (Inline *)callInstr->m_src1;
    this_02 = (char *)funcOpnd;
    OVar3 = IR::Opnd::GetKind((Opnd *)funcOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      this_02 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_0054e296;
      *puVar5 = 0;
    }
    InsertFunctionObjectCheck
              ((Inline *)this_02,(RegOpnd *)funcOpnd,funcObjCheckInsertInstr,
               &bailOutInstr->super_Instr,inlineeInfo);
    this_01 = (ByteCodeUsesInstr *)0x0;
  }
  return this_01;
}

Assistant:

IR::ByteCodeUsesInstr*
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns(IR::Instr *callInstr, IR::Instr * funcObjCheckInsertInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined)
{
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr * useCallTargetInstr = nullptr;
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeInfo, isPolymorphic, isBuiltIn, isCtor, isInlined, safeThis))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        Assert(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr());
        // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after the last bailout before the call.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }
    else
    {
        IR::BailOutInstr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotBuiltIn, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
        InsertFunctionObjectCheck(callInstr->GetSrc1()->AsRegOpnd(), funcObjCheckInsertInstr, bailOutInstr, inlineeInfo);
    }
    return useCallTargetInstr;
}